

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * __thiscall
tinyusdz::to_string_abi_cxx11_(string *__return_storage_ptr__,tinyusdz *this,SourceColorSpace v)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((uint)this < 3) {
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const tinyusdz::UsdUVTexture::SourceColorSpace v) {
  std::string s;

  switch (v) {
    case tinyusdz::UsdUVTexture::SourceColorSpace::Auto: {
      s = "auto";
      break;
    }
    case tinyusdz::UsdUVTexture::SourceColorSpace::Raw: {
      s = "raw";
      break;
    }
    case tinyusdz::UsdUVTexture::SourceColorSpace::SRGB: {
      s = "sRGB";
      break;
    }
  }

  return s;
}